

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# art.c
# Opt level: O2

uint64_t art_allocate_index(art_t *art,art_typecode_t typecode)

{
  ulong uVar1;
  long lVar2;
  void *pvVar3;
  ulong uVar4;
  uint64_t uVar5;
  undefined7 in_register_00000031;
  ulong uVar6;
  uint64_t index;
  ulong uVar7;
  ulong uVar8;
  
  uVar8 = CONCAT71(in_register_00000031,typecode) & 0xffffffff;
  uVar1 = art->first_free[uVar8];
  if (uVar1 == art->capacities[uVar8]) {
    if (uVar1 == 0) {
      uVar6 = 2;
    }
    else if (uVar1 < 0x400) {
      uVar6 = uVar1 * 2;
    }
    else {
      uVar6 = uVar1 * 5 >> 2;
    }
    uVar7 = (ulong)(uint)((int)CONCAT71(in_register_00000031,typecode) * 8);
    *(ulong *)((long)art->capacities + uVar7) = uVar6;
    lVar2 = *(long *)((long)ART_NODE_SIZES + uVar7);
    pvVar3 = roaring_realloc(*(void **)((long)art->nodes + uVar7),lVar2 * uVar6);
    *(void **)((long)art->nodes + uVar7) = pvVar3;
    memset((void *)((uVar1 & 0xffffffffffff) * lVar2 + (long)pvVar3),0,(uVar6 - uVar1) * lVar2);
    uVar7 = uVar1;
    while (uVar4 = uVar7, uVar4 < uVar6) {
      uVar7 = uVar4 + 1;
      if ((byte)(typecode - 1) < 5) {
        *(ulong *)((long)art->nodes[uVar8] + (uVar4 & 0xffffffffffff) * lVar2) = uVar7;
      }
    }
    uVar5 = art->first_free[uVar8] + 1;
  }
  else {
    uVar5 = art_node_get_next_free(art,uVar1 << 0x10 | uVar8);
  }
  art->first_free[uVar8] = uVar5;
  return uVar1;
}

Assistant:

static uint64_t art_allocate_index(art_t *art, art_typecode_t typecode) {
    uint64_t first_free = art->first_free[typecode];
    if (first_free == art->capacities[typecode]) {
        art_extend(art, typecode);
        art->first_free[typecode]++;
        return first_free;
    }
    art->first_free[typecode] = art_next_free(art, typecode);
    return first_free;
}